

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

idx_t duckdb::FindTypedRangeBound<duckdb::interval_t,duckdb::LessThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  WindowColumnIterator<duckdb::interval_t> __last;
  WindowColumnIterator<duckdb::interval_t> __first;
  interval_t iVar1;
  interval_t iVar2;
  interval_t iVar3;
  interval_t iVar4;
  bool bVar5;
  undefined8 uVar6;
  pointer in_RCX;
  pointer in_RDX;
  WindowCursor *in_RSI;
  WindowCursor *in_RDI;
  char in_R8B;
  interval_t iVar7;
  ulong *in_stack_00000010;
  interval_t second;
  interval_t first;
  WindowColumnIterator<duckdb::interval_t> end;
  WindowColumnIterator<duckdb::interval_t> begin;
  interval_t cur_val_1;
  interval_t cur_val;
  OperationCompare<duckdb::interval_t,_duckdb::LessThan> comp;
  interval_t val;
  string *in_stack_fffffffffffffde8;
  WindowColumnIterator<duckdb::interval_t> *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  WindowInputExpression *in_stack_fffffffffffffe08;
  idx_t in_stack_fffffffffffffe10;
  WindowCursor *in_stack_fffffffffffffe18;
  WindowCursor *this;
  OperationCompare<duckdb::interval_t,_duckdb::LessThan> *in_stack_fffffffffffffe88;
  interval_t *in_stack_fffffffffffffe90;
  WindowColumnIterator<duckdb::interval_t> local_140;
  undefined4 local_12c;
  interval_t local_128;
  undefined8 local_118;
  int64_t local_110;
  WindowColumnIterator<duckdb::interval_t> local_108;
  WindowColumnIterator<duckdb::interval_t> local_f8;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  interval_t local_c0;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [48];
  interval_t local_78;
  interval_t local_48;
  char local_29;
  pointer local_28;
  pointer local_20;
  WindowCursor *local_18;
  WindowCursor *local_10;
  ulong local_8;
  
  local_29 = in_R8B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_48 = WindowInputExpression::GetCell<duckdb::interval_t>
                       (in_stack_fffffffffffffe08,
                        CONCAT17(in_stack_fffffffffffffe07,
                                 CONCAT16(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00)));
  OperationCompare<duckdb::interval_t,_duckdb::LessThan>::OperationCompare
            ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)0x1a597cb);
  if (local_29 == '\a') {
    local_78 = WindowCursor::GetCell<duckdb::interval_t>
                         (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (idx_t)in_stack_fffffffffffffe08);
    bVar5 = OperationCompare<duckdb::interval_t,_duckdb::LessThan>::operator()
                      ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)
                       in_stack_fffffffffffffdf0,(interval_t *)in_stack_fffffffffffffde8,
                       (interval_t *)0x1a59844);
    if (bVar5) {
      local_aa = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a8,"Invalid RANGE PRECEDING value",&local_a9);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_aa = 0;
      __cxa_throw(uVar6,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  else {
    local_c0 = WindowCursor::GetCell<duckdb::interval_t>
                         (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (idx_t)in_stack_fffffffffffffe08);
    bVar5 = OperationCompare<duckdb::interval_t,_duckdb::LessThan>::operator()
                      ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)
                       in_stack_fffffffffffffdf0,(interval_t *)in_stack_fffffffffffffde8,
                       (interval_t *)0x1a599ad);
    if (bVar5) {
      local_e2 = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e0,"Invalid RANGE FOLLOWING value",&local_e1);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_e2 = 0;
      __cxa_throw(uVar6,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  WindowColumnIterator<duckdb::interval_t>::WindowColumnIterator(&local_f8,local_10,local_20);
  WindowColumnIterator<duckdb::interval_t>::WindowColumnIterator(&local_108,local_18,local_28);
  iVar4.micros = (int64_t)in_stack_fffffffffffffe18;
  iVar4.months = (undefined4)local_118;
  iVar4.days = local_118._4_4_;
  iVar3.micros = (int64_t)in_stack_fffffffffffffe18;
  iVar3.months = (undefined4)local_118;
  iVar3.days = local_118._4_4_;
  iVar1.micros = local_128.micros;
  iVar1.months = local_128.months;
  iVar1.days = local_128.days;
  iVar7 = iVar4;
  if (*in_stack_00000010 < in_stack_00000010[1]) {
    iVar7 = iVar3;
    if ((local_20 <= *in_stack_00000010) && (iVar7 = iVar4, *in_stack_00000010 < local_28)) {
      iVar7 = WindowCursor::GetCell<duckdb::interval_t>
                        (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                         (idx_t)in_stack_fffffffffffffe08);
      local_110 = iVar7.micros;
    }
    this = (WindowCursor *)iVar7.micros;
    local_118 = iVar7._0_8_;
    iVar2.micros = local_128.micros;
    iVar2.months = local_128.months;
    iVar2.days = local_128.days;
    iVar1.micros = local_128.micros;
    iVar1.months = local_128.months;
    iVar1.days = local_128.days;
    if ((local_20 < in_stack_00000010[1]) && (iVar1 = iVar2, in_stack_00000010[1] < local_28)) {
      local_128 = WindowCursor::GetCell<duckdb::interval_t>
                            (this,in_stack_fffffffffffffe10,(idx_t)in_stack_fffffffffffffe08);
      bVar5 = OperationCompare<duckdb::interval_t,_duckdb::LessThan>::operator()
                        ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)
                         in_stack_fffffffffffffdf0,(interval_t *)in_stack_fffffffffffffde8,
                         (interval_t *)0x1a59bfc);
      if (!bVar5) {
        bVar5 = OperationCompare<duckdb::interval_t,_duckdb::LessThan>::operator()
                          ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)
                           in_stack_fffffffffffffdf0,(interval_t *)in_stack_fffffffffffffde8,
                           (interval_t *)0x1a59c2d);
        if (!bVar5) {
          local_8 = in_stack_00000010[1];
          goto LAB_01a59d76;
        }
        UnsafeNumericCast<long,unsigned_long,void>((local_28 - in_stack_00000010[1]) - 1);
        WindowColumnIterator<duckdb::interval_t>::operator-=
                  (in_stack_fffffffffffffdf0,(difference_type)in_stack_fffffffffffffde8);
      }
      iVar7.micros = (int64_t)this;
      iVar7.months = (undefined4)local_118;
      iVar7.days = local_118._4_4_;
      iVar1 = local_128;
    }
  }
  local_118 = iVar7._0_8_;
  local_128 = iVar1;
  OperationCompare<duckdb::interval_t,_duckdb::LessThan>::OperationCompare
            ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)in_stack_fffffffffffffdf0,
             (OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)in_stack_fffffffffffffde8);
  __first.pos = local_f8.pos;
  __first.coll = local_f8.coll;
  __last.pos = local_108.pos;
  __last.coll = local_108.coll;
  local_140 = ::std::
              upper_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::LessThan>>
                        (__first,__last,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_8 = WindowColumnIterator::operator_cast_to_unsigned_long((WindowColumnIterator *)&local_140)
  ;
  OperationCompare<duckdb::interval_t,_duckdb::LessThan>::~OperationCompare
            ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)0x1a59d46);
LAB_01a59d76:
  local_12c = 1;
  OperationCompare<duckdb::interval_t,_duckdb::LessThan>::~OperationCompare
            ((OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)0x1a59d83);
  return local_8;
}

Assistant:

static idx_t FindTypedRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                                 const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                                 const idx_t chunk_idx, const FrameBounds &prev) {
	D_ASSERT(!boundary.CellIsNull(chunk_idx));
	const auto val = boundary.GetCell<T>(chunk_idx);

	OperationCompare<T, OP> comp;

	// Check that the value we are searching for is in range.
	if (range == WindowBoundary::EXPR_PRECEDING_RANGE) {
		//	Preceding but value past the current value
		const auto cur_val = range_hi.GetCell<T>(0, order_end - 1);
		if (comp(cur_val, val)) {
			throw OutOfRangeException("Invalid RANGE PRECEDING value");
		}
	} else {
		//	Following but value before the current value
		D_ASSERT(range == WindowBoundary::EXPR_FOLLOWING_RANGE);
		const auto cur_val = range_lo.GetCell<T>(0, order_begin);
		if (comp(val, cur_val)) {
			throw OutOfRangeException("Invalid RANGE FOLLOWING value");
		}
	}
	//	Try to reuse the previous bounds to restrict the search.
	//	This is only valid if the previous bounds were non-empty
	WindowColumnIterator<T> begin(range_lo, order_begin);
	WindowColumnIterator<T> end(range_hi, order_end);
	if (prev.start < prev.end) {
		if (order_begin <= prev.start && prev.start < order_end) {
			const auto first = range_lo.GetCell<T>(0, prev.start);
			if (FROM && !comp(val, first)) {
				// If prev.start == val and we are looking for a lower bound, then we are done
				if (!comp(first, val)) {
					return prev.start;
				}
				//	prev.start <= val, so we can start further forward
				begin += UnsafeNumericCast<int64_t>(prev.start - order_begin);
			}
		}
		if (order_begin < prev.end && prev.end < order_end) {
			const auto second = range_hi.GetCell<T>(0, prev.end - 1);
			if (!comp(second, val)) {
				//  If val == prev.end and we are looking for an upper bound, then we are done
				if (!FROM && !comp(val, second)) {
					return prev.end;
				}
				//	val <= prev.end, so we can end further back
				// (prev.second is the largest peer)
				end -= UnsafeNumericCast<int64_t>(order_end - prev.end - 1);
			}
		}
	}

	if (FROM) {
		return idx_t(std::lower_bound(begin, end, val, comp));
	} else {
		return idx_t(std::upper_bound(begin, end, val, comp));
	}
}